

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vpu_api_mlvec.cpp
# Opt level: O0

MPP_RET vpu_api_mlvec_check_cfg(void *p)

{
  uint uVar1;
  char *pcVar2;
  MPP_RET local_28;
  MPP_RET ret;
  RK_U32 magic;
  VpuApiMlvecStaticCfg *cfg;
  void *p_local;
  
  if (p == (void *)0x0) {
    _mpp_log_l(2,"vpu_api_mlvec","invalid NULL input\n","vpu_api_mlvec_check_cfg");
    p_local._4_4_ = MPP_ERR_NULL_PTR;
  }
  else {
    uVar1 = *(uint *)((long)p + 0x34);
    local_28 = MPP_OK;
    if ((uVar1 >> 0x18 != 0x4d) || ((uVar1 >> 0x10 & 0xff) != 0x30)) {
      local_28 = MPP_NOK;
    }
    if ((vpu_api_debug & 0x20000) != 0) {
      pcVar2 = "failed";
      if (local_28 == MPP_OK) {
        pcVar2 = "success";
      }
      _mpp_log_l(4,"vpu_api_mlvec","check mlvec cfg magic %08x %s\n","vpu_api_mlvec_check_cfg",uVar1
                 ,pcVar2);
    }
    p_local._4_4_ = local_28;
  }
  return p_local._4_4_;
}

Assistant:

MPP_RET vpu_api_mlvec_check_cfg(void *p)
{
    if (NULL == p) {
        mpp_err_f("invalid NULL input\n");
        return MPP_ERR_NULL_PTR;
    }

    VpuApiMlvecStaticCfg *cfg = (VpuApiMlvecStaticCfg *)p;
    RK_U32 magic = cfg->magic;
    MPP_RET ret = MPP_OK;

    if ((((magic >> 24) & 0xff) != MLVEC_MAGIC) ||
        (((magic >> 16) & 0xff) != MLVEC_VERSION))
        ret = MPP_NOK;

    mlvec_dbg_flow("check mlvec cfg magic %08x %s\n", magic,
                   (ret == MPP_OK) ? "success" : "failed");

    return ret;
}